

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decomp.c
# Opt level: O3

void ddb_ap(long ndims,double *qedims,Integer *ardims,Integer *pedims,long npes,long npdivs,
           long *pdivs)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  double dVar7;
  
  if (1 < ndims) {
    lVar5 = 0;
    do {
      lVar2 = dd_lk(pdivs,npdivs,qedims[lVar5]);
      lVar1 = pdivs[lVar2];
      pedims[lVar5] = lVar1;
      npes = npes / lVar1;
      if (npes < 2) {
        npes = 1;
      }
      lVar4 = npdivs;
      if (lVar5 < ndims + -2) {
        dVar7 = (double)npes;
        lVar6 = lVar5 + 2;
        lVar3 = lVar6;
        do {
          dVar7 = dVar7 / ((double)ardims[lVar3] / (double)ardims[lVar5 + 1]);
          lVar3 = lVar3 + 1;
        } while (lVar3 < ndims);
        dVar7 = pow(dVar7,1.0 / (double)((ndims + -1) - lVar5));
        qedims[lVar5 + 1] = dVar7;
        lVar3 = ardims[lVar5 + 1];
        do {
          qedims[lVar6] = ((double)ardims[lVar6] / (double)lVar3) * qedims[lVar5 + 1];
          lVar6 = lVar6 + 1;
        } while (lVar6 < ndims);
        if (1 < lVar1) {
          lVar2 = lVar2 + 1;
          if (lVar2 < npdivs) {
            lVar4 = 1;
            do {
              if (pdivs[lVar2] % lVar1 == 0) {
                pdivs[lVar4] = pdivs[lVar2] / lVar1;
                lVar4 = lVar4 + 1;
              }
              lVar2 = lVar2 + 1;
            } while (npdivs != lVar2);
          }
          else {
            lVar4 = 1;
          }
        }
      }
      lVar5 = lVar5 + 1;
      npdivs = lVar4;
    } while (lVar5 != ndims + -1);
  }
  pedims[ndims + -1] = npes;
  return;
}

Assistant:

void ddb_ap(long ndims, double * qedims, Integer * ardims, Integer * pedims,
                  long npes, long npdivs, long * pdivs)
      {
      long bq;
      long i, k, g;
      long idim;
         for(idim=0;idim<ndims-1;idim++){
            g = dd_lk(pdivs,npdivs,qedims[idim]);
            bq = pdivs[g] ;
            pedims[idim] = bq;
            npes /= bq;
            npes = (npes<1) ? 1 : npes;
            if(idim<ndims-2){
               qedims[idim+1] = (double) npes;
               for(i=idim+2;i<ndims;i++) qedims[idim+1] /=
                   (ardims[i]/(double)ardims[idim+1]);
               qedims[idim+1] = (double) pow(qedims[idim+1],
                   1.0/(double)(ndims-1-idim));
               for(i=idim+2;i<ndims;i++){
                   qedims[i] = (ardims[i]/(double)ardims[idim+1])*
                       qedims[idim+1];
               }

               if(bq>1) {
                   for(k=1,i=g+1;i<npdivs;i++){
                       if(pdivs[i]%bq==0) {
                           pdivs[k] = pdivs[i]/bq;
                           k += 1;
                       }
                   }
                   npdivs = k;
               }
            }
         }
         pedims[ndims-1] = npes;
      }